

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfloat16.cpp
# Opt level: O0

QTextStream * operator>>(QTextStream *ts,qfloat16 *f16)

{
  undefined2 *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  float f;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  QTextStream *this;
  
  this = *(QTextStream **)(in_FS_OFFSET + 0x28);
  QTextStream::operator>>
            (this,(float *)CONCAT44(0xffffffff,
                                    CONCAT22(in_stack_fffffffffffffff2,in_stack_fffffffffffffff0)));
  qfloat16::qfloat16((qfloat16 *)this,f16._4_4_);
  *in_RSI = in_stack_fffffffffffffff2;
  if (*(QTextStream **)(in_FS_OFFSET + 0x28) == this) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &operator>>(QTextStream &ts, qfloat16 &f16)
{
    float f;
    ts >> f;
    f16 = qfloat16(f);
    return ts;
}